

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O3

void Abc_NtkVectorPrintPars(Vec_Int_t *vPiValues,int nPars)

{
  ulong uVar1;
  
  if (0 < nPars) {
    uVar1 = 0;
    do {
      if ((long)vPiValues->nSize <= (long)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("%d",(ulong)(uint)vPiValues->pArray[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)nPars != uVar1);
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintPars( Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = 0; i < nPars; i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}